

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FailoverStrategy.cpp
# Opt level: O1

void __thiscall xmrig::FailoverStrategy::onClose(FailoverStrategy *this)

{
  int in_EDX;
  IClient *in_RSI;
  
  onClose((FailoverStrategy *)
          &this[-1].m_pools.super__Vector_base<xmrig::IClient_*,_std::allocator<xmrig::IClient_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_EDX);
  return;
}

Assistant:

void xmrig::FailoverStrategy::onClose(IClient *client, int failures)
{
    if (failures == -1) {
        return;
    }

    if (m_active == client->id()) {
        m_active = -1;
        m_listener->onPause(this);
    }

    if (m_index == 0 && failures < m_retries) {
        return;
    }

    if (m_index == static_cast<size_t>(client->id()) && (m_pools.size() - m_index) > 1) {
        m_pools[++m_index]->connect();
    }
}